

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> * __thiscall
IDenseNetwork::Forward
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,IDenseNetwork *this,
          SpikeTrain *sample,float simulationTime,bool useStdp)

{
  ILayer *this_00;
  size_t __n;
  pointer pfVar1;
  INeuron *pIVar2;
  undefined7 in_register_00000009;
  ulong idx;
  float extraout_XMM0_Da;
  allocator_type local_25;
  float local_24;
  
  this_00 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
  local_24 = simulationTime;
  (**(code **)(*(long *)this->eventManager + 0x20))
            (this->eventManager,sample,
             *(this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
              super__Vector_impl_data._M_start);
  (**(code **)(*(long *)this->eventManager + 0x10))
            (local_24,this->eventManager,CONCAT71(in_register_00000009,useStdp) & 0xffffffff);
  Relax(this,local_24);
  LogBasicStats(this);
  __n = ILayer::GetSize((this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1]);
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,__n,&local_25);
  pfVar1 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (idx = 0; idx < (ulong)((long)(__return_storage_ptr__->
                                    super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pfVar1 >> 2);
      idx = idx + 1) {
    pIVar2 = ILayer::operator[](this_00,idx);
    (*pIVar2->_vptr_INeuron[4])(pIVar2);
    pfVar1 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar1[idx] = extraout_XMM0_Da;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> IDenseNetwork::Forward( const SPIKING_NN::SpikeTrain &sample, float simulationTime, bool useStdp )
{
    ILayer &output = *layers.back();
    eventManager.RegisterSpikeTrain( sample, *layers.front());
    eventManager.RunSimulation( simulationTime, useStdp );
    Relax( simulationTime ).LogBasicStats();

    auto result = std::vector<float>( layers.back()->GetSize());
    for ( size_t idx = 0; idx < result.size(); ++idx ) {
        result[idx] = output[idx]->GetOutput();
    }
    return result;
}